

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTestCaseBase.cpp
# Opt level: O1

bool __thiscall
glcts::TestCaseBase::buildProgramVA
          (TestCaseBase *this,GLuint po_id,bool *out_has_compilation_failed,uint sh_stages,...)

{
  ostringstream *poVar1;
  bool bVar2;
  uint uVar3;
  TestCaseBase *this_00;
  char in_AL;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  uint *puVar7;
  ulong uVar8;
  uint *puVar9;
  GLenum shader_type_00;
  GLenum shader_type_01;
  ulong unaff_RBP;
  undefined8 in_R8;
  undefined8 in_R9;
  GLuint *pGVar10;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  GLuint sh_id;
  GLint compilation_status;
  va_list values;
  GLint shader_type;
  string shader_type_str;
  GLint link_status;
  string info_log;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vec_sh_id;
  string sh_merged_string;
  uint local_324;
  GLuint local_320;
  uint local_31c;
  ulong local_318;
  uint *local_310;
  undefined1 *local_308;
  uint local_2fc;
  TestCaseBase *local_2f8;
  string local_2f0;
  char *local_2d0;
  string local_2c8;
  GLuint *local_2a8;
  iterator iStack_2a0;
  uint *local_298;
  string local_290;
  bool *local_270;
  undefined1 local_268 [120];
  ios_base local_1f0 [264];
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  long lVar6;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_320 = po_id;
  local_2f8 = this;
  local_270 = out_has_compilation_failed;
  local_c8 = in_R8;
  local_c0 = in_R9;
  iVar4 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar4);
  local_2a8 = (GLuint *)0x0;
  iStack_2a0._M_current = (GLuint *)0x0;
  local_298 = (uint *)0x0;
  local_310 = (uint *)&stack0x00000008;
  local_318 = 0x3000000020;
  local_31c = 0;
  local_308 = local_e8;
  if (sh_stages != 0) {
    poVar1 = (ostringstream *)(local_268 + 8);
    do {
      uVar8 = local_318 & 0xffffffff;
      if (uVar8 < 0x29) {
        local_318 = CONCAT44(local_318._4_4_,(int)local_318 + 8);
        puVar7 = (uint *)(local_308 + uVar8);
      }
      else {
        puVar7 = local_310;
        local_310 = local_310 + 2;
      }
      local_324 = *puVar7;
      uVar8 = local_318 & 0xffffffff;
      if (uVar8 < 0x29) {
        local_318 = CONCAT44(local_318._4_4_,(int)local_318 + 8);
        puVar7 = (uint *)(local_308 + uVar8);
      }
      else {
        puVar7 = local_310;
        local_310 = local_310 + 2;
      }
      uVar8 = local_318 & 0xffffffff;
      if (uVar8 < 0x29) {
        local_318 = CONCAT44(local_318._4_4_,(int)local_318 + 8);
        puVar9 = (uint *)(local_308 + uVar8);
      }
      else {
        puVar9 = local_310;
        local_310 = local_310 + 2;
      }
      if (local_324 == 0) {
        bVar2 = false;
      }
      else {
        if (*puVar7 != 0) {
          specializeShader_abi_cxx11_(&local_290,local_2f8,*puVar7,*(char ***)puVar9);
          local_2d0 = local_290._M_dataplus._M_p;
          (**(code **)(lVar6 + 0x12b8))(local_324,1,&local_2d0,0);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"glShaderSource() failed!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                          ,0x19b);
          (**(code **)(lVar6 + 0x248))(local_324);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"glCompileShader() failed!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                          ,0x19e);
          (**(code **)(lVar6 + 0xa70))(local_324,0x8b81,&local_31c);
          dVar5 = (**(code **)(lVar6 + 0x800))();
          glu::checkError(dVar5,"glGetShaderiv() failed!",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                          ,0x1a1);
          uVar3 = local_31c;
          unaff_RBP = (ulong)local_31c;
          bVar2 = false;
          if (local_31c != 1) {
            local_2fc = 0;
            getInfoLog_abi_cxx11_(&local_2c8,local_2f8,LT_SHADER_OBJECT,local_324);
            (**(code **)(lVar6 + 0xa70))(local_324,0x8b4f,&local_2fc);
            getShaderTypeName_abi_cxx11_(&local_2f0,(glcts *)(ulong)local_2fc,shader_type_00);
            local_268._0_8_ = ((local_2f8->super_TestCase).super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," compilation failure:\n\n",0x17);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n\n",2);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," source:\n\n",10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,local_290._M_dataplus._M_p,local_290._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n\n",2);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_1f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
              operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
              operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1
                             );
            }
            bVar2 = true;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290._M_dataplus._M_p != &local_290.field_2) {
            operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
          }
          if (uVar3 != 1) goto LAB_00cf5476;
        }
        (**(code **)(lVar6 + 0x10))(local_320,local_324);
        dVar5 = (**(code **)(lVar6 + 0x800))();
        glu::checkError(dVar5,"glAttachShader(VERTEX_SHADER) call failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                        ,0x1b6);
        if (iStack_2a0._M_current == local_298) {
          bVar2 = false;
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_2a8,iStack_2a0,
                     &local_324);
        }
        else {
          *iStack_2a0._M_current = local_324;
          iStack_2a0._M_current = iStack_2a0._M_current + 1;
          bVar2 = false;
        }
      }
LAB_00cf5476:
    } while ((!bVar2) && (sh_stages = sh_stages - 1, sh_stages != 0));
  }
  if (local_270 != (bool *)0x0) {
    *local_270 = local_31c == 0;
  }
  if (local_31c == 1) {
    local_2d0 = (char *)((ulong)local_2d0 & 0xffffffff00000000);
    (**(code **)(lVar6 + 0xce8))(local_320);
    this_00 = local_2f8;
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glLinkProgram() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                    ,0x1cb);
    (**(code **)(lVar6 + 0x9d8))(local_320,0x8b82,&local_2d0);
    dVar5 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar5,"glGetProgramiv() failed!",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/esextcTestCaseBase.cpp"
                    ,0x1ce);
    uVar8 = CONCAT71((int7)(unaff_RBP >> 8),(int)local_2d0 == 1);
    if ((int)local_2d0 != 1) {
      getInfoLog_abi_cxx11_(&local_290,this_00,LT_PROGRAM_OBJECT,local_320);
      local_268._0_8_ = ((this_00->super_TestCase).super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_268 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      local_320 = (GLuint)uVar8;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Link failure:\n\n",0xf);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,local_290._M_dataplus._M_p,local_290._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n\n",2);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_1f0);
      if (local_2a8 != iStack_2a0._M_current) {
        poVar1 = (ostringstream *)(local_268 + 8);
        pGVar10 = local_2a8;
        do {
          local_324 = 0;
          (**(code **)(lVar6 + 0xa70))(*pGVar10,0x8b4f,&local_324);
          getShaderTypeName_abi_cxx11_(&local_2c8,(glcts *)(ulong)local_324,shader_type_01);
          getShaderSource_abi_cxx11_(&local_2f0,this_00,*pGVar10);
          local_268._0_8_ = ((this_00->super_TestCase).super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_2c8._M_dataplus._M_p,local_2c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," source:\n\n",10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,local_2f0._M_dataplus._M_p,local_2f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n\n",2);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_268,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_1f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
            operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
            operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
          }
          pGVar10 = pGVar10 + 1;
        } while (pGVar10 != iStack_2a0._M_current);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      uVar8 = (ulong)local_320;
    }
  }
  else {
    uVar8 = 0;
  }
  if (local_2a8 != (GLuint *)0x0) {
    operator_delete(local_2a8,(long)local_298 - (long)local_2a8);
  }
  return (bool)(char)uVar8;
}

Assistant:

bool TestCaseBase::buildProgramVA(glw::GLuint po_id, bool* out_has_compilation_failed, unsigned int sh_stages, ...)
{
	const glw::Functions&	gl = m_context.getRenderContext().getFunctions();
	std::vector<glw::GLuint> vec_sh_id;

	va_list values;
	va_start(values, sh_stages);

	/* Shaders compilation */
	glw::GLint compilation_status = GL_FALSE;

	for (unsigned int stage = 0; stage < sh_stages; ++stage)
	{
		glw::GLuint		   sh_id	= va_arg(values, glw::GLuint);
		unsigned int	   sh_parts = va_arg(values, unsigned int);
		const char* const* sh_code  = va_arg(values, const char* const*);

		if (sh_id == 0)
		{
			continue;
		}

		if (sh_parts != 0)
		{
			std::string sh_merged_string = specializeShader(sh_parts, sh_code);
			const char* sh_merged_ptr	= sh_merged_string.c_str();

			gl.shaderSource(sh_id, 1, &sh_merged_ptr, NULL);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() failed!");

			gl.compileShader(sh_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() failed!");

			gl.getShaderiv(sh_id, GL_COMPILE_STATUS, &compilation_status);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() failed!");

			if (compilation_status != GL_TRUE)
			{
				glw::GLint  shader_type = 0;
				std::string info_log	= getCompilationInfoLog(sh_id);

				gl.getShaderiv(sh_id, GL_SHADER_TYPE, &shader_type);
				std::string shader_type_str = getShaderTypeName(shader_type);

				m_testCtx.getLog() << tcu::TestLog::Message << shader_type_str << " compilation failure:\n\n"
								   << info_log << "\n\n"
								   << shader_type_str << " source:\n\n"
								   << sh_merged_string << "\n\n"
								   << tcu::TestLog::EndMessage;

				break;
			}
		}

		gl.attachShader(po_id, sh_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glAttachShader(VERTEX_SHADER) call failed");

		vec_sh_id.push_back(sh_id);
	}

	va_end(values);

	if (out_has_compilation_failed != NULL)
	{
		*out_has_compilation_failed = (compilation_status == GL_FALSE);
	}

	if (compilation_status != GL_TRUE)
	{
		return false;
	}

	/* Linking the program */

	glw::GLint link_status = GL_FALSE;
	gl.linkProgram(po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glLinkProgram() failed!");

	gl.getProgramiv(po_id, GL_LINK_STATUS, &link_status);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetProgramiv() failed!");

	if (link_status != GL_TRUE)
	{
		/* Dump link log */
		std::string link_log = getLinkingInfoLog(po_id);
		m_testCtx.getLog() << tcu::TestLog::Message << "Link failure:\n\n"
						   << link_log << "\n\n"
						   << tcu::TestLog::EndMessage;

		/* Dump shader source */
		for (std::vector<glw::GLuint>::iterator it = vec_sh_id.begin(); it != vec_sh_id.end(); ++it)
		{
			glw::GLint shader_type = 0;
			gl.getShaderiv(*it, GL_SHADER_TYPE, &shader_type);
			std::string shader_type_str = getShaderTypeName(shader_type);
			std::string shader_source   = getShaderSource(*it);
			m_testCtx.getLog() << tcu::TestLog::Message << shader_type_str << " source:\n\n"
							   << shader_source << "\n\n"
							   << tcu::TestLog::EndMessage;
		}

		return false;
	}

	return true;
}